

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothubtransport_amqp_cbs_auth.c
# Opt level: O1

int authentication_start(AUTHENTICATION_HANDLE authentication_handle,CBS_HANDLE cbs_handle)

{
  LOGGER_LOG p_Var1;
  int iVar2;
  int iVar3;
  char *pcVar4;
  
  if (authentication_handle == (AUTHENTICATION_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x173;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x173;
    }
    pcVar4 = "authentication_start failed (authentication_handle is NULL)";
    iVar2 = 0x174;
  }
  else if (cbs_handle == (CBS_HANDLE)0x0) {
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x178;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x178;
    }
    pcVar4 = "authentication_start failed (cbs_handle is NULL)";
    iVar2 = 0x179;
  }
  else {
    if (authentication_handle->state == AUTHENTICATION_STATE_STOPPED) {
      authentication_handle->cbs_handle = cbs_handle;
      authentication_handle->state = AUTHENTICATION_STATE_STARTING;
      if (authentication_handle->on_state_changed_callback ==
          (ON_AUTHENTICATION_STATE_CHANGED_CALLBACK)0x0) {
        return 0;
      }
      (*authentication_handle->on_state_changed_callback)
                (authentication_handle->on_state_changed_callback_context,
                 AUTHENTICATION_STATE_STOPPED,AUTHENTICATION_STATE_STARTING);
      return 0;
    }
    p_Var1 = xlogging_get_log_function();
    iVar3 = 0x181;
    if (p_Var1 == (LOGGER_LOG)0x0) {
      return 0x181;
    }
    pcVar4 = "authentication_start failed (messenger has already been started; current state: %d)";
    iVar2 = 0x182;
  }
  (*p_Var1)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_client/src/iothubtransport_amqp_cbs_auth.c"
            ,"authentication_start",iVar2,1,pcVar4);
  return iVar3;
}

Assistant:

int authentication_start(AUTHENTICATION_HANDLE authentication_handle, const CBS_HANDLE cbs_handle)
{
    int result;

    if (authentication_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("authentication_start failed (authentication_handle is NULL)");
    }
    else if (cbs_handle == NULL)
    {
        result = MU_FAILURE;
        LogError("authentication_start failed (cbs_handle is NULL)");
    }
    else
    {
        AUTHENTICATION_INSTANCE* instance = (AUTHENTICATION_INSTANCE*)authentication_handle;

        if (instance->state != AUTHENTICATION_STATE_STOPPED)
        {
            result = MU_FAILURE;
            LogError("authentication_start failed (messenger has already been started; current state: %d)", instance->state);
        }
        else
        {
            instance->cbs_handle = cbs_handle;

            update_state(instance, AUTHENTICATION_STATE_STARTING);

            result = RESULT_OK;
        }
    }

    return result;
}